

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

VkSurfaceKHR
create_surface_glfw(VkInstance instance,GLFWwindow *window,VkAllocationCallbacks *allocator)

{
  int iVar1;
  ostream *poVar2;
  char *pcStack_38;
  int ret;
  char *error_msg;
  VkSurfaceKHR pVStack_28;
  VkResult err;
  VkSurfaceKHR surface;
  VkAllocationCallbacks *allocator_local;
  GLFWwindow *window_local;
  VkInstance instance_local;
  
  pVStack_28 = (VkSurfaceKHR)0x0;
  surface = (VkSurfaceKHR)allocator;
  allocator_local = (VkAllocationCallbacks *)window;
  window_local = (GLFWwindow *)instance;
  error_msg._4_4_ =
       glfwCreateWindowSurface
                 (instance,window,allocator,(VkSurfaceKHR_conflict *)&stack0xffffffffffffffd8);
  if (error_msg._4_4_ != VK_SUCCESS) {
    iVar1 = glfwGetError(&stack0xffffffffffffffc8);
    if (iVar1 != 0) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::operator<<(poVar2," ");
      if (pcStack_38 != (char *)0x0) {
        std::operator<<((ostream *)&std::cout,pcStack_38);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    pVStack_28 = (VkSurfaceKHR)0x0;
  }
  return pVStack_28;
}

Assistant:

VkSurfaceKHR create_surface_glfw(VkInstance instance, GLFWwindow* window, VkAllocationCallbacks* allocator = nullptr) {
    VkSurfaceKHR surface = VK_NULL_HANDLE;
    VkResult err = glfwCreateWindowSurface(instance, window, allocator, &surface);
    if (err) {
        const char* error_msg;
        int ret = glfwGetError(&error_msg);
        if (ret != 0) {
            std::cout << ret << " ";
            if (error_msg != nullptr) std::cout << error_msg;
            std::cout << "\n";
        }
        surface = VK_NULL_HANDLE;
    }
    return surface;
}